

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O1

double __thiscall
Js::DateImplementation::SetDateData
          (DateImplementation *this,Arguments *args,DateData dd,bool fUtc,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Var aValue;
  ulong uVar5;
  uint uVar6;
  Type *pTVar7;
  undefined4 *puVar8;
  Type tv;
  double dVar9;
  undefined1 local_b8 [8];
  YMD emptyYMD;
  undefined4 *local_90 [2];
  double rgdbl [5];
  
  emptyYMD._8_12_ = SUB1612((undefined1  [16])0x0,4);
  _local_b8 = SUB1612((undefined1  [16])0x0,0);
  emptyYMD.yt = 0;
  if (9 < dd._value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x687,"(false)","DateData type invalid");
    if (bVar2) {
      *puVar8 = 0;
      JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
    goto LAB_00b4db13;
  }
  uVar6 = 0;
  if ((byte)(dd._value - 10) < 0xfe && ((ulong)args->Info & 0xffffff) != 1) {
    register0x00000000 = (ulong)*(uint *)(mpddcvar + (ulong)dd._value * 4);
    local_90[0] = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar6 = 0;
    uVar5 = 1;
    do {
      aValue = Arguments::operator[](args,(int)uVar5);
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = local_90[0];
        *local_90[0] = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00b4db13;
        *puVar8 = 0;
      }
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        puVar8 = (undefined4 *)(double)(int)aValue;
      }
      else if ((ulong)aValue >> 0x32 == 0) {
        puVar8 = (undefined4 *)JavascriptConversion::ToNumber_Full(aValue,scriptContext);
      }
      else {
        puVar8 = (undefined4 *)((ulong)aValue ^ 0xfffc000000000000);
      }
      local_90[uVar5] = puVar8;
      bVar2 = NumberUtilities::IsFinite((double)puVar8);
      if (!bVar2) goto LAB_00b4d728;
      puVar8 = (undefined4 *)ConvertToInteger((double)local_90[uVar5]);
      local_90[uVar5] = puVar8;
      uVar6 = uVar6 + 1;
    } while ((uVar5 < (*(uint *)&args->Info & 0xffffff) - 1) &&
            (bVar2 = uVar5 < stack0xffffffffffffff68, uVar5 = uVar5 + 1, bVar2));
  }
  if (uVar6 == 0) {
LAB_00b4d728:
    this->m_grfval = 0;
    dVar9 = NAN;
    goto LAB_00b4da95;
  }
  bVar2 = NumberUtilities::IsNan(this->m_tvUtc);
  if (bVar2) {
    if (1 < dd._value) goto LAB_00b4d728;
    pTVar7 = (Type *)local_b8;
    tv = 0.0;
  }
  else {
    uVar3 = this->m_grfval;
    if (fUtc) {
      if ((uVar3 & 4) == 0) {
        DateUtilities::GetYmdFromTv(this->m_tvUtc,&this->m_ymdUtc);
        *(byte *)&this->m_grfval = (byte)this->m_grfval | 4;
      }
      pTVar7 = &this->m_ymdUtc;
      tv = this->m_tvUtc;
    }
    else {
      if ((uVar3 & 2) == 0) {
        if ((uVar3 & 1) == 0) {
          dVar9 = GetTvLcl<Js::ScriptContext>(this->m_tvUtc,scriptContext,&this->m_tzd);
          this->m_tvLcl = dVar9;
          *(byte *)&this->m_grfval = (byte)this->m_grfval | 1;
        }
        DateUtilities::GetYmdFromTv(this->m_tvLcl,&this->m_ymdLcl);
        *(byte *)&this->m_grfval = (byte)this->m_grfval | 2;
      }
      pTVar7 = &this->m_ymdLcl;
      tv = this->m_tvLcl;
    }
  }
  uVar4 = 0;
  uVar3 = 0;
  switch(dd._value) {
  case '\0':
    if (((double)local_90[1] < 100.0) && (0.0 <= (double)local_90[1])) {
      local_90[1] = (undefined4 *)((double)local_90[1] + 1900.0);
    }
  case '\x01':
switchD_00b4d7e9_caseD_1:
    if ((uVar6 < 3) && (rgdbl[1] = (double)(pTVar7->mday + 1), uVar6 != 2)) {
      rgdbl[0] = (double)pTVar7->mon;
    }
    tv = DateUtilities::TvFromDate
                   ((double)local_90[1],rgdbl[0],rgdbl[1] + -1.0,(double)pTVar7->time);
    break;
  case '\x02':
    memmove_xplat(rgdbl,local_90 + 1,(ulong)uVar6 << 3);
    uVar6 = uVar6 + 1;
    local_90[1] = (undefined4 *)(double)pTVar7->year;
    goto switchD_00b4d7e9_caseD_1;
  case '\x03':
    tv = tv + (((double)local_90[1] - (double)pTVar7->mday) + -1.0) * 86400000.0;
    uVar3 = 1;
    if (uVar6 != 1) goto LAB_00b4d8d5;
    break;
  case '\x04':
LAB_00b4d8d5:
    tv = tv + (rgdbl[(ulong)uVar3 - 1] - (double)(pTVar7->time / 3600000)) * 3600000.0;
    uVar4 = uVar3 + 1;
    if (uVar4 < uVar6) goto LAB_00b4d91a;
    break;
  case '\x05':
LAB_00b4d91a:
    tv = tv + (rgdbl[(ulong)uVar4 - 1] - (double)((pTVar7->time / 60000) % 0x3c)) * 60000.0;
    uVar4 = uVar4 + 1;
    if (uVar4 < uVar6) goto LAB_00b4d97d;
    break;
  case '\x06':
LAB_00b4d97d:
    tv = tv + (rgdbl[(ulong)uVar4 - 1] - (double)((pTVar7->time / 1000) % 0x3c)) * 1000.0;
    uVar4 = uVar4 + 1;
    if (uVar4 < uVar6) goto switchD_00b4d7e9_caseD_7;
    break;
  case '\a':
switchD_00b4d7e9_caseD_7:
    tv = tv + (rgdbl[(ulong)uVar4 - 1] - (double)(pTVar7->time % 1000));
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x6fa,"(false)","DataData type invalid");
    if (!bVar2) {
LAB_00b4db13:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  this->m_grfval = 0;
  if (fUtc) {
    dVar9 = DoubleToTvUtc(tv);
  }
  else {
    dVar9 = GetTvUtc<Js::ScriptContext>(tv,scriptContext);
  }
LAB_00b4da95:
  this->m_tvUtc = dVar9;
  this->field_0x58 = this->field_0x58 | 1;
  return dVar9;
}

Assistant:

double DateImplementation::SetDateData(Arguments args, DateData dd, bool fUtc, ScriptContext* scriptContext)
    {
        // This must accommodate the largest cvar in mpddcvar.
        double rgdbl[5];

        double tv = 0;
        DateTime::YMD *pymd = NULL;
        DateTime::YMD emptyYMD = {0};
        uint count = 0;

        uint cvarMax;
        uint ivar;

        // PREFAST: check limits
        if (dd < 0 || dd >= DateData::Lim)
        {
            AssertMsg(false, "DateData type invalid");
            Js::JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
        }

        // Get the parameters.
        cvarMax = mpddcvar[dd];

        __analysis_assume(cvarMax <= 4);

        //
        // arg[0] would be the date object itself
        //
        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < cvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

            if (!Js::NumberUtilities::IsFinite(rgdbl[ivar]))
                goto LSetNan;

            rgdbl[ivar] = ConvertToInteger(rgdbl[ivar]);
        }

        if ((count = ivar) < 1)
        {
            goto LSetNan;
        }

        if (JavascriptNumber::IsNan(m_tvUtc))
        {


            // If the current time is not finite, the only way we can end up
            // with non-NaN is for setFullYear/setYear.
            // See ES5 15.9.5.40, ES5 B.2.5.
            if (!(DateData::FullYear == dd || DateData::Year == dd))
            {
                goto LSetNan;
            }
            pymd = &emptyYMD;           // We need mon, mday, time to be 0.
            // Fall through to DateData::Year and DataData::FullYear cases below.
        }
        else
        {
            if (fUtc)
            {
                EnsureYmdUtc();
                pymd = &m_ymdUtc;
                tv = m_tvUtc;
            }
            else
            {
                EnsureYmdLcl(scriptContext);
                pymd = &m_ymdLcl;
                tv = m_tvLcl;
            }
        }

        ivar = 0;
        switch (dd)
        {
        case DateData::Year:
            if (rgdbl[0] < 100 && rgdbl[0] >= 0)
                rgdbl[0] += 1900;
            // fall-through
        case DateData::FullYear:
    LFullYear:
            if (count < 3)
            {
                // Only {year} or {year, month} is specified. Day is not specified.
                rgdbl[2] = pymd->mday + 1;
                if (count < 2)
                {
                    // Month is not specified.
                    rgdbl[1] = pymd->mon;
                }
            }
            tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1, pymd->time);
            break;
        case DateData::Month:
            memmove(rgdbl + 1, rgdbl, count * sizeof(double));
            count++;
            rgdbl[0] = pymd->year;
            goto LFullYear;
        case DateData::Date:
            tv += (rgdbl[ivar] - pymd->mday - 1) * 86400000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Hours:
            tv += (rgdbl[ivar] - (pymd->time / 3600000)) * 3600000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Minutes:
            tv += (rgdbl[ivar] - (pymd->time / 60000) % 60) * 60000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Seconds:
            tv += (rgdbl[ivar] - (pymd->time / 1000) % 60) * 1000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Milliseconds:
            tv += rgdbl[ivar] - pymd->time % 1000;
            break;
        default:
            AssertMsg(false, "DataData type invalid");
        }

        if (fUtc)
        {
            SetTvUtc(tv);
        }
        else
        {
            SetTvLcl(tv, scriptContext);
        }

        m_modified = true;
        return m_tvUtc;

    LSetNan:
        m_grfval = 0;
        m_tvUtc = JavascriptNumber::NaN;
        m_modified = true;

        return m_tvUtc;
    }